

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btGenericPoolAllocator.cpp
# Opt level: O0

void __thiscall
btGenericMemoryPool::init_pool(btGenericMemoryPool *this,size_t element_size,size_t element_count)

{
  void *pvVar1;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 *in_RDI;
  size_t i;
  int alignment;
  size_t in_stack_ffffffffffffffe0;
  ulong uVar2;
  
  in_RDI[3] = 0;
  in_RDI[4] = 0;
  in_RDI[5] = in_RSI;
  in_RDI[6] = in_RDX;
  alignment = (int)((ulong)in_RDI >> 0x20);
  pvVar1 = btAlignedAllocInternal(in_stack_ffffffffffffffe0,alignment);
  *in_RDI = pvVar1;
  pvVar1 = btAlignedAllocInternal(in_stack_ffffffffffffffe0,alignment);
  in_RDI[1] = pvVar1;
  pvVar1 = btAlignedAllocInternal(in_stack_ffffffffffffffe0,alignment);
  in_RDI[2] = pvVar1;
  for (uVar2 = 0; uVar2 < (ulong)in_RDI[6]; uVar2 = uVar2 + 1) {
    *(undefined8 *)(in_RDI[2] + uVar2 * 8) = 0;
  }
  return;
}

Assistant:

void btGenericMemoryPool::init_pool(size_t element_size, size_t element_count)
{
	m_allocated_count = 0;
	m_free_nodes_count = 0;

	m_element_size = element_size;
	m_max_element_count = element_count;




	m_pool = (unsigned char *) btAlignedAlloc(m_element_size*m_max_element_count,16);
	m_free_nodes = (size_t *) btAlignedAlloc(sizeof(size_t)*m_max_element_count,16);
	m_allocated_sizes = (size_t *) btAlignedAlloc(sizeof(size_t)*m_max_element_count,16);

	for (size_t i = 0;i< m_max_element_count;i++ )
	{
		m_allocated_sizes[i] = 0;
	}
}